

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

bool nivalis::detail::has_var_ast(AST *ast,uint32_t addr)

{
  pointer pAVar1;
  anon_union_8_3_343d95dd_for_ASTNode_1 *paVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  pAVar1 = (ast->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(ast->
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
  if (lVar3 == 0) {
    bVar6 = false;
  }
  else {
    uVar4 = lVar3 >> 4;
    paVar2 = &pAVar1->field_1;
    bVar6 = true;
    uVar5 = 1;
    do {
      if (((((ASTNode *)(paVar2 + -1))->opcode < 0x13) &&
          ((0x60004U >> (((ASTNode *)(paVar2 + -1))->opcode & 0x1f) & 1) != 0)) &&
         (paVar2->ref == (ulong)addr)) {
        return bVar6;
      }
      bVar6 = uVar5 < uVar4;
      lVar3 = (-(ulong)(uVar4 == 0) - uVar4) + uVar5;
      uVar5 = uVar5 + 1;
      paVar2 = paVar2 + 2;
    } while (lVar3 != 0);
  }
  return bVar6;
}

Assistant:

bool has_var_ast(const Expr::AST& ast, uint32_t addr) {
    for (size_t i = 0; i < ast.size(); ++i) {
        if (OpCode::has_ref(ast[i].opcode) &&
            ast[i].opcode != OpCode::arg &&
            ast[i].ref == addr) {
            return true;
        }
    }
    return false;
}